

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> kj::anon_unknown_0::TestWebSocketService::doWebSocket(WebSocket *ws,StringPtr message)

{
  PromiseNode *pPVar1;
  undefined8 uVar2;
  long *plVar3;
  size_t sVar4;
  TransformPromiseNodeBase *pTVar5;
  long in_RCX;
  char *pcVar6;
  char *pcVar7;
  ChainPromiseNode *pCVar8;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  ChainPromiseNode *extraout_RDX_01;
  ChainPromiseNode *extraout_RDX_02;
  ChainPromiseNode *extraout_RDX_03;
  _func_int **pp_Var9;
  Own<kj::_::ChainPromiseNode> OVar10;
  Promise<void> PVar11;
  String copy;
  Own<kj::_::PromiseNode> local_88;
  undefined1 local_78 [24];
  long *local_60;
  Own<kj::_::PromiseNode> local_58;
  String local_48;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pp_Var9 = (_func_int **)message.content.ptr;
  heapString(&local_48,in_RCX - 1);
  if (in_RCX - 1U != 0) {
    pcVar7 = (char *)local_48.content.size_;
    if ((char *)local_48.content.size_ != (char *)0x0) {
      pcVar7 = local_48.content.ptr;
    }
    memcpy(pcVar7,(void *)message.content.size_,in_RCX - 1U);
  }
  pcVar7 = (char *)local_48.content.size_;
  if ((char *)local_48.content.size_ != (char *)0x0) {
    pcVar7 = local_48.content.ptr;
  }
  pcVar6 = (char *)0x0;
  if ((char *)local_48.content.size_ != (char *)0x0) {
    pcVar6 = (char *)(local_48.content.size_ + -1);
  }
  (**(code **)(*pp_Var9 + 8))(local_78,pp_Var9,pcVar7,pcVar6);
  Promise<void>::attach<kj::String>((Promise<void> *)(local_78 + 0x10),(String *)local_78);
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,(Own<kj::_::PromiseNode> *)(local_78 + 0x10),
             _::
             TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:1964:15),_kj::_::PropagateException>
             ::anon_class_8_1_3fcf679a_for_func::operator());
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045c2d8;
  pTVar5[1].super_PromiseNode._vptr_PromiseNode = pp_Var9;
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::_::Void,kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)pTVar5;
  OVar10 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_88);
  pPVar1 = local_88.ptr;
  local_58.disposer._0_4_ = local_30;
  local_58.disposer._4_4_ = uStack_2c;
  local_58.ptr = (PromiseNode *)CONCAT44(uStack_24,uStack_28);
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar10.ptr);
  }
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_58,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:1966:13),_kj::_::PropagateException>
             ::anon_class_8_1_3fcf679a_for_func::operator());
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045c360;
  pTVar5[1].super_PromiseNode._vptr_PromiseNode = pp_Var9;
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::(anonymous_namespace)::TestWebSocketService::doWebSocket(kj::WebSocket&,kj::StringPtr)::{lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)pTVar5;
  OVar10 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_88);
  pPVar1 = local_88.ptr;
  pCVar8 = OVar10.ptr;
  *(undefined4 *)&ws->_vptr_WebSocket = local_30;
  *(undefined4 *)((long)&ws->_vptr_WebSocket + 4) = uStack_2c;
  *(undefined4 *)&ws[1]._vptr_WebSocket = uStack_28;
  *(undefined4 *)((long)&ws[1]._vptr_WebSocket + 4) = uStack_24;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar8 = extraout_RDX;
  }
  pPVar1 = local_58.ptr;
  if (local_58.ptr != (PromiseNode *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar8 = extraout_RDX_00;
  }
  plVar3 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (***(_func_int ***)local_78._16_8_)(local_78._16_8_,*(long *)(*plVar3 + -0x10) + (long)plVar3);
    pCVar8 = extraout_RDX_01;
  }
  uVar2 = local_78._8_8_;
  if ((long *)local_78._8_8_ != (long *)0x0) {
    local_78._8_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_78._0_8_)
              (local_78._0_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
    pCVar8 = extraout_RDX_02;
  }
  sVar4 = local_48.content.size_;
  pcVar7 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar7,1,sVar4,sVar4,0);
    pCVar8 = extraout_RDX_03;
  }
  PVar11.super_PromiseBase.node.ptr = &pCVar8->super_PromiseNode;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)ws;
  return (Promise<void>)PVar11.super_PromiseBase.node;
}

Assistant:

static kj::Promise<void> doWebSocket(WebSocket& ws, kj::StringPtr message) {
    auto copy = kj::str(message);
    return ws.send(copy).attach(kj::mv(copy))
        .then([&ws]() {
      return ws.receive();
    }).then([&ws](WebSocket::Message&& message) {
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(str, kj::String) {
          return doWebSocket(ws, kj::str("reply:", str));
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          return doWebSocket(ws, kj::str("reply:", data));
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          auto reason = kj::str("close-reply:", close.reason);
          return ws.close(close.code + 1, reason).attach(kj::mv(reason));
        }
      }
      KJ_UNREACHABLE;
    });
  }